

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lexer.cpp
# Opt level: O1

Token __thiscall slang::parsing::Lexer::lexEscapeSequence(Lexer *this,bool isMacroName)

{
  byte bVar1;
  ulong uVar2;
  byte *pbVar3;
  TokenKind kind;
  Token TVar4;
  SyntaxKind local_4;
  
  pbVar3 = (byte *)this->sourceBuffer;
  bVar1 = *pbVar3;
  uVar2 = (ulong)bVar1;
  if ((bVar1 == 0) || ((bVar1 < 0x21 & (byte)(0x100003e00 >> (bVar1 & 0x3f))) != 0)) {
    if ((bVar1 == 0xd) || (bVar1 == 10)) {
      this->sourceBuffer = (char *)(pbVar3 + 1);
      if ((bVar1 == 0xd) && (pbVar3[1] == 10)) {
        this->sourceBuffer = (char *)(pbVar3 + 2);
      }
      kind = LineContinuation;
    }
    else {
      kind = Unknown;
    }
  }
  else {
    pbVar3 = (byte *)(this->sourceBuffer + 1);
    do {
      if (0x5e < (byte)((char)uVar2 - 0x20U)) break;
      this->sourceBuffer = (char *)pbVar3;
      uVar2 = (ulong)*pbVar3;
      pbVar3 = pbVar3 + 1;
    } while ((0x20 < uVar2) || ((0x100003e00U >> (uVar2 & 0x3f) & 1) == 0));
    if (isMacroName) {
      TVar4 = create<slang::syntax::SyntaxKind>(this,Directive,&local_4);
      return TVar4;
    }
    kind = Identifier;
  }
  TVar4 = create<>(this,kind);
  return TVar4;
}

Assistant:

Token Lexer::lexEscapeSequence(bool isMacroName) {
    char c = peek();
    if (isWhitespace(c) || c == '\0') {
        // Check for a line continuation sequence.
        if (isNewline(c)) {
            advance();
            if (c == '\r' && peek() == '\n')
                advance();
            return create(TokenKind::LineContinuation);
        }

        // Error issued in the Preprocessor
        return create(TokenKind::Unknown);
    }

    while (isPrintableASCII(c)) {
        advance();
        c = peek();
        if (isWhitespace(c))
            break;
    }

    if (isMacroName)
        return create(TokenKind::Directive, SyntaxKind::MacroUsage);

    return create(TokenKind::Identifier);
}